

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHDivCollapsed.cpp
# Opt level: O0

void __thiscall
TPZCompElHDivCollapsed<pzshape::TPZShapeTriang>::SetSideOrient
          (TPZCompElHDivCollapsed<pzshape::TPZShapeTriang> *this,int side,int sideorient)

{
  undefined4 in_EDX;
  int in_ESI;
  long in_RDI;
  int firstside;
  size_t in_stack_000003f8;
  char *in_stack_00000400;
  int in_stack_ffffffffffffffe8;
  int side_00;
  
  side_00 = 3;
  if ((in_ESI < 3) || (7 < in_ESI)) {
    pzinternal::DebugStopImpl(in_stack_00000400,in_stack_000003f8);
  }
  if (in_ESI < 6) {
    TPZCompElHDiv<pzshape::TPZShapeTriang>::SetSideOrient
              ((TPZCompElHDiv<pzshape::TPZShapeTriang> *)CONCAT44(in_ESI,in_EDX),side_00,
               in_stack_ffffffffffffffe8);
  }
  else if (in_ESI == 6) {
    *(undefined4 *)(in_RDI + 0xe8) = in_EDX;
  }
  else {
    *(undefined4 *)(in_RDI + 0xec) = in_EDX;
  }
  return;
}

Assistant:

void TPZCompElHDivCollapsed<TSHAPE>::SetSideOrient(int side, int sideorient)
{
    int firstside = TSHAPE::NSides-TSHAPE::NFacets-1;
    if (side < firstside || side >= TSHAPE::NSides + 1) {
        DebugStop();
    }

    if(side < TSHAPE::NSides-1) TPZCompElHDiv<TSHAPE>::SetSideOrient(side, sideorient);
    else if(side == TSHAPE::NSides-1 ) fbottom_side_orient = sideorient;
    else ftop_side_orient = sideorient;
}